

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcPth.c
# Opt level: O2

void Wla_ManConcurrentBmc3(Wla_Man_t *pWla,Aig_Man_t *pAig,Abc_Cex_t **ppCex)

{
  int iVar1;
  pthread_t *__newthread;
  undefined8 *__arg;
  
  if (pWla->pThread != (void *)0x0) {
    __assert_fail("pWla->pThread == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                  ,0x97,"void Wla_ManConcurrentBmc3(Wla_Man_t *, Aig_Man_t *, Abc_Cex_t **)");
  }
  __newthread = (pthread_t *)calloc(1,8);
  pWla->pThread = __newthread;
  __arg = (undefined8 *)calloc(1,0x20);
  *__arg = pWla;
  __arg[1] = pAig;
  __arg[2] = ppCex;
  *(int *)(__arg + 3) = g_nRunIds;
  *(int *)((long)__arg + 0x1c) = pWla->pPars->fVerbose;
  iVar1 = pthread_create(__newthread,(pthread_attr_t *)0x0,Wla_Bmc3Thread,__arg);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                ,0xa2,"void Wla_ManConcurrentBmc3(Wla_Man_t *, Aig_Man_t *, Abc_Cex_t **)");
}

Assistant:

void Wla_ManConcurrentBmc3( Wla_Man_t * pWla, Aig_Man_t * pAig, Abc_Cex_t ** ppCex )
{
    int status;
    Bmc3_ThData_t * pData;

    assert( pWla->pThread == NULL );
    pWla->pThread = (void *)ABC_CALLOC( pthread_t, 1 );

    pData = ABC_CALLOC( Bmc3_ThData_t, 1 );
    pData->pWla = pWla;
    pData->pAig = pAig;
    pData->ppCex = ppCex;
    pData->RunId = g_nRunIds;
    pData->fVerbose = pWla->pPars->fVerbose;

    status = pthread_create( (pthread_t *)pWla->pThread, NULL, Wla_Bmc3Thread, pData );
    assert( status == 0 );
}